

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O2

void oah_print(ion_hashmap_t *hash_map,int size,ion_record_info_t *record)

{
  int iVar1;
  int iVar2;
  int j;
  long lVar3;
  uint uVar4;
  
  puts("Printing map");
  if (size < 1) {
    size = 0;
  }
  for (uVar4 = 0; uVar4 != size; uVar4 = uVar4 + 1) {
    printf("%d -- %i ",(ulong)uVar4,
           (ulong)(uint)(int)hash_map->entry
                             [(int)((record->key_size + record->value_size + 1) * uVar4)]);
    iVar2 = record->key_size;
    iVar1 = record->value_size;
    if (hash_map->entry[(int)((iVar2 + iVar1 + 1) * uVar4)] == -1) {
      printf("(null)");
    }
    else {
      lVar3 = 0;
      while( true ) {
        if (iVar1 + iVar2 <= lVar3) break;
        printf("%X ",(ulong)(byte)hash_map->entry
                                  [lVar3 + 1 + (long)(int)((iVar1 + iVar2 + 1) * uVar4)]);
        lVar3 = lVar3 + 1;
        iVar2 = record->key_size;
        iVar1 = record->value_size;
      }
    }
    putchar(10);
  }
  return;
}

Assistant:

void
oah_print(
	ion_hashmap_t		*hash_map,
	int					size,
	ion_record_info_t	*record
) {
	int i;

	printf("Printing map\n");

	for (i = 0; i < size; i++) {
		printf("%d -- %i ", i, ((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status);
		{
			if (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->status == (ION_EMPTY | ION_DELETED)) {
				printf("(null)");
			}
			else {
				int j;

				for (j = 0; j < (record->key_size + record->value_size); j++) {
					printf("%X ", *(ion_byte_t *) (((ion_hash_bucket_t *) ((hash_map->entry + (record->key_size + record->value_size + SIZEOF(STATUS)) * i)))->data + j));
				}
			}

			printf("\n");
		}
	}
}